

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
::find_non_soo<google::protobuf::FileDescriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
           *this,key_arg<const_google::protobuf::FileDescriptor_*> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char cVar5;
  ctrl_t *pcVar6;
  anon_union_8_1_a8a14541_for_iterator_2 aVar7;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ushort uVar12;
  ulong uVar13;
  __m128i match;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  iterator iVar21;
  char cVar16;
  char cVar18;
  char cVar19;
  char cVar20;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar9 = hash >> 7 ^ uVar3 >> 0xc;
  auVar14 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar14 = pshuflw(auVar14,auVar14,0);
  uVar10 = 0;
  do {
    uVar9 = uVar9 & uVar2;
    pcVar1 = (char *)(uVar3 + uVar9);
    cVar5 = pcVar1[0xf];
    cVar16 = auVar14[0];
    auVar17[0] = -(cVar16 == *pcVar1);
    cVar18 = auVar14[1];
    auVar17[1] = -(cVar18 == pcVar1[1]);
    cVar19 = auVar14[2];
    auVar17[2] = -(cVar19 == pcVar1[2]);
    cVar20 = auVar14[3];
    auVar17[3] = -(cVar20 == pcVar1[3]);
    auVar17[4] = -(cVar16 == pcVar1[4]);
    auVar17[5] = -(cVar18 == pcVar1[5]);
    auVar17[6] = -(cVar19 == pcVar1[6]);
    auVar17[7] = -(cVar20 == pcVar1[7]);
    auVar17[8] = -(cVar16 == pcVar1[8]);
    auVar17[9] = -(cVar18 == pcVar1[9]);
    auVar17[10] = -(cVar19 == pcVar1[10]);
    auVar17[0xb] = -(cVar20 == pcVar1[0xb]);
    auVar17[0xc] = -(cVar16 == pcVar1[0xc]);
    auVar17[0xd] = -(cVar18 == pcVar1[0xd]);
    auVar17[0xe] = -(cVar19 == pcVar1[0xe]);
    auVar17[0xf] = -(cVar20 == cVar5);
    uVar12 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf;
    uVar11 = (uint)uVar12;
    while (uVar12 != 0) {
      uVar4 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar13 = uVar4 + uVar9 & uVar2;
      lVar8 = uVar13 * 0x20;
      if (*(key_arg<const_google::protobuf::FileDescriptor_*> *)(*(long *)(this + 0x18) + lVar8) ==
          *key) {
        if (uVar3 == 0) {
          __assert_fail("ctrl != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x9ef,
                        "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
                       );
        }
        aVar7.slot_ = (slot_type *)(*(long *)(this + 0x18) + lVar8);
        pcVar6 = (ctrl_t *)(uVar3 + uVar13);
        goto LAB_0023aefa;
      }
      uVar12 = (ushort)(uVar11 - 1) & (ushort)uVar11;
      uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar12);
    }
    auVar15[0] = -(*pcVar1 == -0x80);
    auVar15[1] = -(pcVar1[1] == -0x80);
    auVar15[2] = -(pcVar1[2] == -0x80);
    auVar15[3] = -(pcVar1[3] == -0x80);
    auVar15[4] = -(pcVar1[4] == -0x80);
    auVar15[5] = -(pcVar1[5] == -0x80);
    auVar15[6] = -(pcVar1[6] == -0x80);
    auVar15[7] = -(pcVar1[7] == -0x80);
    auVar15[8] = -(pcVar1[8] == -0x80);
    auVar15[9] = -(pcVar1[9] == -0x80);
    auVar15[10] = -(pcVar1[10] == -0x80);
    auVar15[0xb] = -(pcVar1[0xb] == -0x80);
    auVar15[0xc] = -(pcVar1[0xc] == -0x80);
    auVar15[0xd] = -(pcVar1[0xd] == -0x80);
    auVar15[0xe] = -(pcVar1[0xe] == -0x80);
    auVar15[0xf] = -(cVar5 == -0x80);
    if ((((((((((((((((auVar15 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar15 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar15 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar15 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar15 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar15 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar15 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar15 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar15 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar15 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar15 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar15 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar5 == -0x80) {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                  *)this);
      pcVar6 = (ctrl_t *)0x0;
      aVar7 = extraout_RDX;
LAB_0023aefa:
      iVar21.field_1.slot_ = aVar7.slot_;
      iVar21.ctrl_ = pcVar6;
      return iVar21;
    }
    uVar9 = uVar9 + uVar10 + 0x10;
    uVar10 = uVar10 + 0x10;
    if (uVar2 < uVar10) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>, K = const google::protobuf::FileDescriptor *]"
                   );
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }